

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O3

Gia_Man_t *
Gia_ManCheckFalseAll(Gia_Man_t *p,int nSlackMax,int nTimeOut,int fVerbose,int fVeryVerbose)

{
  uint uVar1;
  int iVar2;
  Gia_Man_t *p_00;
  Gia_Man_t *p_01;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  uint local_44;
  
  p_00 = Gia_ManDup(p);
  local_44 = 0;
  iVar3 = 0;
  do {
    Gia_ManLevelNum(p_00);
    iVar4 = iVar3;
    if (0 < p_00->nObjs) {
      lVar6 = 0;
      lVar5 = 0;
      do {
        if (p_00->pObjs == (Gia_Obj_t *)0x0) break;
        uVar1 = *(uint *)(&p_00->pObjs->field_0x0 + lVar6);
        if ((~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1) {
          iVar2 = Gia_ObjLevelId((Gia_Man_t *)p_00->vLevels,(int)lVar5);
          if (iVar2 <= nSlackMax) {
            local_44 = local_44 + 1;
            p_01 = Gia_ManCheckOne(p_00,-1,(int)lVar5,nTimeOut,fVerbose,fVeryVerbose);
            if (p_01 != (Gia_Man_t *)0x0) {
              iVar4 = iVar4 + 1;
              Gia_ManStop(p_00);
              Gia_ManLevelNum(p_01);
              p_00 = p_01;
            }
          }
        }
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0xc;
      } while (lVar5 < p_00->nObjs);
    }
    bVar7 = iVar3 == iVar4;
    iVar3 = iVar4;
    if (bVar7) {
      printf("Performed %d attempts and %d changes.\n",(ulong)local_44);
      return p_00;
    }
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManCheckFalseAll( Gia_Man_t * p, int nSlackMax, int nTimeOut, int fVerbose, int fVeryVerbose )
{
    int Tried = 0, Changed = 0;
    p = Gia_ManDup( p );
    while ( 1 )
    {
        Gia_Man_t * pNew;
        Gia_Obj_t * pObj;
        int i, LevelMax, Changed0 = Changed;
        LevelMax = Gia_ManLevelNum( p );
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( Gia_ObjLevel(p, pObj) > nSlackMax )
                continue;
            Tried++;
            pNew = Gia_ManCheckOne( p, -1, i, nTimeOut, fVerbose, fVeryVerbose );
            if ( pNew == NULL )
                continue;
            Changed++;
            Gia_ManStop( p );
            p = pNew;
            LevelMax = Gia_ManLevelNum( p );
        }
        if ( Changed0 == Changed )
            break;
    }
//    if ( fVerbose )
        printf( "Performed %d attempts and %d changes.\n", Tried, Changed );
    return p;
}